

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int m_flush_block_resumable(aec_stream *strm)

{
  undefined8 *puVar1;
  long in_RDI;
  bool bVar2;
  int n;
  internal_state *state;
  int local_28;
  uint local_4;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x40);
  if ((puVar1[0xb] - (long)(puVar1 + 0xc)) - (ulong)*(uint *)((long)puVar1 + 0x2c) <
      *(ulong *)(in_RDI + 0x20)) {
    local_28 = ((int)puVar1[0xb] - ((int)puVar1 + 0x60)) - *(int *)((long)puVar1 + 0x2c);
  }
  else {
    local_28 = (int)*(undefined8 *)(in_RDI + 0x20);
  }
  memcpy(*(void **)(in_RDI + 0x18),
         (void *)((long)puVar1 + (ulong)*(uint *)((long)puVar1 + 0x2c) + 0x60),(long)local_28);
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + (long)local_28;
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) - (long)local_28;
  *(int *)((long)puVar1 + 0x2c) = local_28 + *(int *)((long)puVar1 + 0x2c);
  bVar2 = *(long *)(in_RDI + 0x20) != 0;
  if (bVar2) {
    *puVar1 = m_get_block;
  }
  local_4 = (uint)bVar2;
  return local_4;
}

Assistant:

static int m_flush_block_resumable(struct aec_stream *strm)
{
    /**
       Slow and restartable flushing
    */
    struct internal_state *state = strm->state;

    int n = (int)MIN((size_t)(state->cds - state->cds_buf - state->i),
                     strm->avail_out);
    memcpy(strm->next_out, state->cds_buf + state->i, n);
    strm->next_out += n;
    strm->avail_out -= n;
    state->i += n;

    if (strm->avail_out == 0) {
        return M_EXIT;
    } else {
        state->mode = m_get_block;
        return M_CONTINUE;
    }
}